

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O2

size_t TdokuEnumerate(char *puzzle,size_t limit,_func_void_char_ptr_void_ptr *callback,
                     void *callback_arg)

{
  char cVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int index;
  size_t *psVar13;
  size_t *psVar14;
  int elm_i;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  char buf [736];
  size_t *local_570;
  Bitvec16x16 local_540;
  SolverDpllTriadSimd<2> local_520 [2];
  
  (anonymous_namespace)::solver_enum._488_16_ = (undefined1  [16])0x0;
  cVar1 = puzzle[0x51];
  (anonymous_namespace)::solver_enum._480_8_ = limit;
  (anonymous_namespace)::solver_enum._504_8_ = callback;
  (anonymous_namespace)::solver_enum._512_8_ = callback_arg;
  anon_unknown.dwarf_d932::State::State(&local_520[0].solution_);
  if (cVar1 < '.') {
    auVar19[8] = 0x2e;
    auVar19._0_8_ = 0x2e2e2e2e2e2e2e2e;
    auVar19[9] = 0x2e;
    auVar19[10] = 0x2e;
    auVar19[0xb] = 0x2e;
    auVar19[0xc] = 0x2e;
    auVar19[0xd] = 0x2e;
    auVar19[0xe] = 0x2e;
    auVar19[0xf] = 0x2e;
    auVar19[0x10] = 0x2e;
    auVar19[0x11] = 0x2e;
    auVar19[0x12] = 0x2e;
    auVar19[0x13] = 0x2e;
    auVar19[0x14] = 0x2e;
    auVar19[0x15] = 0x2e;
    auVar19[0x16] = 0x2e;
    auVar19[0x17] = 0x2e;
    auVar19[0x18] = 0x2e;
    auVar19[0x19] = 0x2e;
    auVar19[0x1a] = 0x2e;
    auVar19[0x1b] = 0x2e;
    auVar19[0x1c] = 0x2e;
    auVar19[0x1d] = 0x2e;
    auVar19[0x1e] = 0x2e;
    auVar19[0x1f] = 0x2e;
    lVar8 = vpcmpeqb_avx512vl(auVar19,*(undefined1 (*) [32])(puzzle + 0x20));
    uVar2 = vpcmpeqb_avx512vl(auVar19,*(undefined1 (*) [32])puzzle);
    for (uVar16 = ~(lVar8 << 0x20 | CONCAT44(extraout_var,(int)uVar2)); uVar16 != 0;
        uVar16 = uVar16 - 1 & uVar16) {
      iVar7 = 0;
      for (uVar5 = uVar16; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
        iVar7 = iVar7 + 1;
      }
      anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::InitClue
                (puzzle,&local_520[0].solution_,iVar7);
    }
    auVar18[8] = 0x2e;
    auVar18._0_8_ = 0x2e2e2e2e2e2e2e2e;
    auVar18[9] = 0x2e;
    auVar18[10] = 0x2e;
    auVar18[0xb] = 0x2e;
    auVar18[0xc] = 0x2e;
    auVar18[0xd] = 0x2e;
    auVar18[0xe] = 0x2e;
    auVar18[0xf] = 0x2e;
    uVar16 = vpcmpb_avx512vl(auVar18,*(undefined1 (*) [16])(puzzle + 0x40),4);
    while (uVar12 = (uint)uVar16, uVar12 != 0) {
      uVar3 = 0;
      for (uVar4 = uVar12; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
        uVar3 = uVar3 + 1;
      }
      anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::InitClue
                (puzzle,&local_520[0].solution_,uVar3 | 0x40);
      uVar16 = (ulong)(uVar12 - 1 & uVar12);
    }
    if (puzzle[0x50] != '.') {
      anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::InitClue(puzzle,&local_520[0].solution_,0x50)
      ;
    }
    bVar6 = anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::BandEliminate<0>
                      (&local_520[0].solution_,0,1);
    if ((((!bVar6) ||
         (bVar6 = anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::BandEliminate<1>
                            (&local_520[0].solution_,0,1), !bVar6)) ||
        (bVar6 = anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::BandEliminate<0>
                           (&local_520[0].solution_,1,2), !bVar6)) ||
       ((bVar6 = anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::BandEliminate<1>
                           (&local_520[0].solution_,1,2), !bVar6 ||
        (bVar6 = anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::BandEliminate<0>
                           (&local_520[0].solution_,2,0), !bVar6)))) goto LAB_00104993;
    puzzle = (char *)0x2;
    bVar6 = anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::BandEliminate<1>
                      (&local_520[0].solution_,2,0);
    if (!bVar6) goto LAB_00104993;
  }
  else {
    local_570 = &local_520[0].limit_;
    memcpy(local_570,puzzle,0x2d9);
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      lVar11 = 0;
      psVar14 = local_570;
      while (lVar11 != 3) {
        local_540.vec[1] = 0x1ff01ff01ff01ff;
        local_540.vec[0] = 0x1ff01ff01ff01ff;
        local_540.vec[2] = 0x1ff01ff01ff01ff;
        local_540.vec[3] = 0x1ff01ff01ff01ff;
        iVar7 = 0;
        psVar13 = psVar14;
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          index = iVar7;
          for (lVar10 = 0; lVar10 != 0x1b; lVar10 = lVar10 + 9) {
            auVar17[8] = 0x2e;
            auVar17._0_8_ = 0x2e2e2e2e2e2e2e2e;
            auVar17[9] = 0x2e;
            auVar17[10] = 0x2e;
            auVar17[0xb] = 0x2e;
            auVar17[0xc] = 0x2e;
            auVar17[0xd] = 0x2e;
            auVar17[0xe] = 0x2e;
            auVar17[0xf] = 0x2e;
            uVar2 = vpcmpb_avx512vl(auVar17,*(undefined1 (*) [16])((long)psVar13 + lVar10),4);
            Bitvec16x16::Insert(&local_540,index,(ushort)uVar2 & 0x1ff);
            index = index + 1;
          }
          psVar13 = (size_t *)((long)psVar13 + 0x51);
          iVar7 = iVar7 + 4;
        }
        uVar12 = (int)lVar11 + (int)lVar8 * 3;
        puzzle = (char *)(ulong)uVar12;
        bVar6 = anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::BoxRestrict<0>
                          (&local_520[0].solution_,uVar12,&local_540);
        lVar11 = lVar11 + 1;
        psVar14 = (size_t *)((long)psVar14 + 0x1b);
        if (!bVar6) goto LAB_00104993;
      }
      local_570 = (size_t *)((long)local_570 + 0xf3);
    }
  }
  anon_unknown.dwarf_d932::SolverDpllTriadSimd<2>::CountSolutionsConsistentWithPartialAssignment
            (local_520,(State *)puzzle);
LAB_00104993:
  sVar9 = (anonymous_namespace)::solver_enum._488_8_;
  return sVar9;
}

Assistant:

size_t TdokuEnumerate(const char *puzzle, size_t limit,
                      void (*callback)(const char *, void *), void *callback_arg) {
    solver_enum.callback_ = callback;
    solver_enum.callback_arg_ = callback_arg;
    return solver_enum.SolveSudoku(puzzle, limit, nullptr, nullptr);
}